

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetLinkerTool
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  undefined8 uVar4;
  int iVar5;
  cmValue cVar6;
  string *psVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  bool bVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string linkerType;
  string usingLinker;
  undefined1 local_118 [32];
  string local_f8;
  int *local_d8;
  string local_d0;
  int *local_b0;
  undefined1 local_a8 [32];
  int *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  string *local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  bVar12 = this->DeviceLink != false;
  local_58 = "";
  if (bVar12) {
    local_58 = "DEVICE_";
  }
  local_a8._0_8_ = &DAT_00000006;
  local_a8._8_8_ = "CMAKE_";
  local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88 = (int *)(lang->_M_dataplus)._M_p;
  local_a8._24_8_ = lang->_M_string_length;
  local_80 = 0;
  local_78 = 7;
  local_70 = "_USING_";
  local_60 = (string *)0x0;
  if (bVar12) {
    local_60 = (string *)0x7;
  }
  local_68 = 0;
  local_50 = 0;
  local_48 = 7;
  local_40 = "LINKER_";
  local_38 = 0;
  views._M_len = 5;
  views._M_array = (iterator)local_a8;
  cmCatViews(&local_d0,views);
  pcVar1 = this->Makefile;
  local_a8._0_8_ = local_d0._M_string_length;
  local_a8._8_8_ = local_d0._M_dataplus._M_p;
  local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8._24_8_ = 4;
  local_88 = (int *)0x82507d;
  local_80 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_a8;
  cmCatViews((string *)local_118,views_00);
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_118);
  if ((string *)local_118._0_8_ != (string *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
  }
  if ((cVar6.Value == (string *)0x0) ||
     (value._M_str = "TOOL", value._M_len = 4, local_a8._0_8_ = cVar6,
     iVar5 = cmValue::Compare((cmValue *)local_a8,value), iVar5 != 0)) {
    pcVar1 = this->Makefile;
    local_a8._0_8_ = (string *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CMAKE_LINKER","");
    psVar7 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_a8);
    if (psVar7 == (string *)0x0) {
      psVar7 = &cmValue::Empty_abi_cxx11_;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar7->_M_string_length);
    local_118._16_8_ = local_a8._16_8_;
    local_118._0_8_ = local_a8._0_8_;
    if ((string *)local_a8._0_8_ == (string *)(local_a8 + 0x10)) goto LAB_004b18e7;
  }
  else {
    GetLinkerTypeProperty((string *)local_118,this,lang,config);
    if (local_118._8_8_ == 0) {
      std::__cxx11::string::_M_replace((ulong)local_118,0,(char *)0x0,0x81d23d);
    }
    local_a8._0_8_ = local_d0._M_string_length;
    local_a8._8_8_ = local_d0._M_dataplus._M_p;
    local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8._24_8_ = local_118._8_8_;
    local_88 = (int *)local_118._0_8_;
    local_80 = 0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_a8;
    cmCatViews(&local_f8,views_01);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    psVar7 = (string *)cmMakefile::GetDefinition(this->Makefile,&local_d0);
    if (psVar7 == (string *)0x0) {
      iVar5 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
      if ((((byte)iVar5 & local_118._8_8_ == 7) != 1) ||
         (*(int *)(local_118._0_8_ + 3) != 0x544c5541 || *(int *)local_118._0_8_ != 0x41464544)) {
        pcVar1 = this->Makefile;
        local_a8._0_8_ = (string *)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CMAKE_LINKER","");
        psVar7 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_a8);
        if ((string *)local_a8._0_8_ != (string *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        uVar4 = local_118._0_8_;
        if (local_118._8_8_ == 7) {
          if (*(int *)(local_118._0_8_ + 3) == 0x544c5541 && *(int *)local_118._0_8_ == 0x41464544)
          goto LAB_004b18aa;
          local_d8 = (int *)(local_118._0_8_ + 7);
          lVar10 = 1;
LAB_004b1a06:
          piVar9 = (int *)(local_118._0_8_ + (local_118._8_8_ & 0xfffffffffffffffc));
          lVar10 = lVar10 + 1;
          piVar11 = (int *)(local_118._0_8_ + 3);
          local_b0 = local_d8;
          do {
            iVar5 = isupper((int)*(char *)((long)piVar11 + -3));
            if (iVar5 == 0) {
              piVar11 = (int *)((long)piVar11 + -3);
              goto LAB_004b1b2a;
            }
            iVar5 = isupper((int)*(char *)((long)piVar11 + -2));
            if (iVar5 == 0) {
              piVar11 = (int *)((long)piVar11 + -2);
              goto LAB_004b1b2a;
            }
            iVar5 = isupper((int)*(char *)((long)piVar11 + -1));
            if (iVar5 == 0) {
              piVar11 = (int *)((long)piVar11 + -1);
              goto LAB_004b1b2a;
            }
            iVar5 = isupper((int)(char)*piVar11);
            if (iVar5 == 0) goto LAB_004b1b2a;
            lVar10 = lVar10 + -1;
            piVar11 = piVar11 + 1;
            piVar8 = local_b0;
          } while (1 < lVar10);
        }
        else {
          local_d8 = (int *)(local_118._0_8_ + local_118._8_8_);
          lVar10 = (long)local_118._8_8_ >> 2;
          piVar8 = local_d8;
          piVar9 = (int *)local_118._0_8_;
          if (0 < lVar10) goto LAB_004b1a06;
        }
        lVar10 = (long)piVar8 - (long)piVar9;
        if (lVar10 == 1) {
LAB_004b1b14:
          iVar5 = isupper((int)(char)*piVar9);
          piVar11 = piVar9;
          if (iVar5 != 0) {
            piVar11 = local_d8;
          }
LAB_004b1b2a:
          local_88 = (int *)uVar4;
          if (piVar11 == local_d8) goto LAB_004b1bdb;
          pcVar3 = this->LocalGenerator;
          local_a8._0_8_ = (string *)0xd;
          local_a8._8_8_ = "LINKER_TYPE \'";
          local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_a8._24_8_ = local_118._8_8_;
          local_80 = 0;
          local_78 = 0x2c;
          local_70 = "\' is unknown. Did you forget to define the \'";
          local_68 = 0;
          local_60 = (string *)local_d0._M_string_length;
          local_58 = local_d0._M_dataplus._M_p;
          local_50 = 0;
          local_48 = 0xb;
          local_40 = "\' variable?";
          local_38 = 0;
          views_02._M_len = 5;
          views_02._M_array = (iterator)local_a8;
          cmCatViews(&local_f8,views_02);
          cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_f8);
        }
        else {
          if (lVar10 == 2) {
LAB_004b1afb:
            iVar5 = isupper((int)(char)*piVar9);
            piVar11 = piVar9;
            if (iVar5 != 0) {
              piVar9 = (int *)((long)piVar9 + 1);
              goto LAB_004b1b14;
            }
            goto LAB_004b1b2a;
          }
          if (lVar10 == 3) {
            iVar5 = isupper((int)(char)*piVar9);
            piVar11 = piVar9;
            if (iVar5 != 0) {
              piVar9 = (int *)((long)piVar9 + 1);
              goto LAB_004b1afb;
            }
            goto LAB_004b1b2a;
          }
LAB_004b1bdb:
          local_a8._24_8_ = local_118._8_8_;
          local_88 = (int *)uVar4;
          pcVar3 = this->LocalGenerator;
          local_a8._0_8_ = (string *)0xd;
          local_a8._8_8_ = "LINKER_TYPE \'";
          local_a8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_80 = 0;
          local_78 = 0x30;
          local_70 = "\' is unknown or not supported by this toolchain.";
          local_68 = 0;
          views_03._M_len = 3;
          views_03._M_array = (iterator)local_a8;
          cmCatViews(&local_f8,views_03);
          cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_004b18aa;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
LAB_004b18aa:
      if (psVar7 == (string *)0x0) {
        psVar7 = &cmValue::Empty_abi_cxx11_;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar7->_M_string_length);
    }
    if ((string *)local_118._0_8_ == (string *)(local_118 + 0x10)) goto LAB_004b18e7;
  }
  operator_delete((void *)local_118._0_8_,
                  (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_118._16_8_)->_M_dataplus)._M_p + 1));
LAB_004b18e7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTool(const std::string& lang,
                                             const std::string& config) const
{
  auto usingLinker =
    cmStrCat("CMAKE_", lang, "_USING_", this->IsDeviceLink() ? "DEVICE_" : "",
             "LINKER_");
  auto format = this->Makefile->GetDefinition(cmStrCat(usingLinker, "MODE"));
  if (!format || format != "TOOL"_s) {
    return this->Makefile->GetDefinition("CMAKE_LINKER");
  }

  auto linkerType = this->GetLinkerTypeProperty(lang, config);
  if (linkerType.empty()) {
    linkerType = "DEFAULT";
  }
  usingLinker = cmStrCat(usingLinker, linkerType);
  auto linkerTool = this->Makefile->GetDefinition(usingLinker);

  if (!linkerTool) {
    if (this->GetGlobalGenerator()->IsVisualStudio() &&
        linkerType == "DEFAULT"_s) {
      return std::string{};
    }

    // fall-back to generic definition
    linkerTool = this->Makefile->GetDefinition("CMAKE_LINKER");

    if (linkerType != "DEFAULT"_s) {
      auto isCMakeLinkerType = [](const std::string& type) -> bool {
        return std::all_of(type.cbegin(), type.cend(),
                           [](char c) { return std::isupper(c); });
      };
      if (isCMakeLinkerType(linkerType)) {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown or not supported by this toolchain."));
      } else {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown. Did you forget to define the '", usingLinker,
                   "' variable?"));
      }
    }
  }

  return linkerTool;
}